

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O3

void __thiscall
PruneReplayer::access_raytracing_pipeline
          (PruneReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar1;
  unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
  *this_00;
  PruneReplayer *this_01;
  const_iterator cVar2;
  VkPipelineLibraryCreateInfoKHR *pVVar3;
  iterator iVar4;
  long lVar5;
  ulong uVar6;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_50;
  PruneReplayer *local_48;
  undefined8 local_40;
  Hash local_38;
  
  puVar1 = &this->accessed_raytracing_pipelines;
  local_38 = hash;
  cVar2 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&puVar1->_M_h,&local_38);
  if (cVar2.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
    local_50 = &puVar1->_M_h;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)puVar1,&local_38);
    local_48 = this;
    access_pipeline_layout(this,(Hash)create_info->layout);
    if (create_info->stageCount != 0) {
      puVar1 = &local_48->accessed_shader_modules;
      lVar5 = 0x18;
      uVar6 = 0;
      do {
        local_40 = *(undefined8 *)((long)&create_info->pStages->sType + lVar5);
        local_50 = &puVar1->_M_h;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)puVar1,&local_40,&local_50);
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x30;
      } while (uVar6 < create_info->stageCount);
    }
    this_01 = local_48;
    pVVar3 = create_info->pLibraryInfo;
    if ((pVVar3 != (VkPipelineLibraryCreateInfoKHR *)0x0) && (pVVar3->libraryCount != 0)) {
      this_00 = &local_48->library_raytracing_pipelines;
      uVar6 = 0;
      do {
        local_50 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)pVVar3->pLibraries[uVar6];
        iVar4 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,(key_type *)&local_50);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
            ._M_cur != (__node_type *)0x0) {
          access_raytracing_pipeline
                    (this_01,*(Hash *)((long)iVar4.
                                             super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
                                             ._M_cur + 8),
                     *(VkRayTracingPipelineCreateInfoKHR **)
                      ((long)iVar4.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
                             ._M_cur + 0x10));
        }
        uVar6 = uVar6 + 1;
        pVVar3 = create_info->pLibraryInfo;
      } while (uVar6 < pVVar3->libraryCount);
    }
  }
  return;
}

Assistant:

void access_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info)
	{
		if (accessed_raytracing_pipelines.count(hash))
			return;
		accessed_raytracing_pipelines.insert(hash);

		access_pipeline_layout((Hash) create_info->layout);
		for (uint32_t stage = 0; stage < create_info->stageCount; stage++)
			accessed_shader_modules.insert((Hash) create_info->pStages[stage].module);

		if (create_info->pLibraryInfo)
		{
			for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
			{
				// Only need to recurse if a pipeline was only allowed due to having CREATE_LIBRARY_KHR flag.
				auto lib_itr = library_raytracing_pipelines.find((Hash) create_info->pLibraryInfo->pLibraries[i]);
				if (lib_itr != library_raytracing_pipelines.end())
					access_raytracing_pipeline(lib_itr->first, lib_itr->second);
			}
		}
	}